

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall
capnp::Orphan<capnp::DynamicValue>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  uint16_t uVar2;
  SegmentReader *pSVar3;
  ulong uVar4;
  size_t sVar5;
  Which elementType;
  undefined8 uVar6;
  ElementSize elementSize;
  StructSize size;
  int64_t iVar7;
  ArrayPtr<const_unsigned_char> AVar8;
  StructSchema in_stack_ffffffffffffff48;
  undefined1 local_b0 [16];
  Fault f;
  StructReader local_88;
  ListReader local_58;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_0025983b;
  case UINT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_0025983b:
    (__return_storage_ptr__->field_1).intValue = iVar7;
    break;
  case FLOAT:
    iVar7 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    break;
  case TEXT:
    AVar8 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asTextReader(&this->builder);
    __return_storage_ptr__->type = TEXT;
    goto LAB_0025988b;
  case DATA:
    AVar8 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asDataReader(&this->builder);
    __return_storage_ptr__->type = DATA;
LAB_0025988b:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar8;
    break;
  case LIST:
    uVar4 = (this->field_1).uintValue;
    sVar5 = *(size_t *)((long)&this->field_1 + 8);
    elementType = LIST;
    if ((uVar4 & 0xff0000) == 0) {
      elementType = (Which)uVar4;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    capnp::_::OrphanBuilder::asListReader(&local_58,&this->builder,elementSize);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_58.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_58.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_58.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_58._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_58.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_58._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_58.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_58.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_58.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_58.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_58.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).uintValue = uVar4;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = sVar5;
    break;
  case ENUM:
    iVar7 = (this->field_1).intValue;
    uVar2 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    iVar7 = (this->field_1).intValue;
    size = anon_unknown_71::structSizeFromSchema(in_stack_ffffffffffffff48);
    capnp::_::OrphanBuilder::asStructReader(&local_88,&this->builder,size);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_88._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_88.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_88._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_88._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_88._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_88.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_88.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_88.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_88.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = iVar7;
    break;
  case CAPABILITY:
    pSVar3 = (SegmentReader *)(this->field_1).intValue;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)local_b0);
    uVar6 = local_b0._8_8_;
    f.exception = (Exception *)local_b0._0_8_;
    local_b0._8_8_ = (SegmentBuilder *)0x0;
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)local_b0._0_8_;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = uVar6;
    (__return_storage_ptr__->field_1).listValue.reader.segment = pSVar3;
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_b0);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x845,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal(&f);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader Orphan<DynamicValue>::getReader() const {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asTextReader();
    case DynamicValue::DATA: return builder.asDataReader();
    case DynamicValue::LIST:
      return DynamicList::Reader(listSchema,
          builder.asListReader(elementSizeFor(listSchema.whichElementType())));
    case DynamicValue::STRUCT:
      return DynamicStruct::Reader(structSchema,
          builder.asStructReader(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                     "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}